

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void TableSettingsHandler_ApplyAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  ImGuiTable *pIVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  
  uVar3 = (ctx->Tables).Map.Data.Size;
  if (uVar3 != 0) {
    lVar2 = 8;
    uVar4 = 0;
    do {
      pIVar1 = (ctx->Tables).Buf.Data;
      lVar5 = (long)*(int *)((long)&((ctx->Tables).Map.Data.Data)->key + lVar2);
      if (pIVar1 != (ImGuiTable *)0x0 && lVar5 != -1) {
        pIVar1[lVar5].IsSettingsRequestLoad = true;
        pIVar1[lVar5].SettingsOffset = -1;
        uVar3 = (ctx->Tables).Map.Data.Size;
      }
      uVar4 = uVar4 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar4 != uVar3);
  }
  return;
}

Assistant:

T*          TryGetMapData(ImPoolIdx n)          { int idx = Map.Data[n].val_i; if (idx == -1) return NULL; return GetByIndex(idx); }